

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_slab.c
# Opt level: O2

void ngx_slab_free_pages(ngx_slab_pool_t *pool,ngx_slab_page_t *page,ngx_uint_t pages)

{
  ulong uVar1;
  ngx_slab_page_t *pnVar2;
  ngx_slab_page_t *pnVar3;
  long lVar4;
  
  pool->pfree = pool->pfree + pages;
  page->slab = pages;
  lVar4 = pages - 1;
  if (lVar4 != 0) {
    memset(page + 1,0,lVar4 * 0x18);
  }
  if (page->next != (ngx_slab_page_t *)0x0) {
    uVar1 = page->prev;
    *(ngx_slab_page_t **)((uVar1 & 0xfffffffffffffffc) + 8) = page->next;
    page->next->prev = uVar1;
  }
  pnVar3 = page + pages;
  if (((pnVar3 < pool->last) && (uVar1 = pnVar3->prev, (uVar1 & 3) == 0)) &&
     (pnVar2 = pnVar3->next, pnVar2 != (ngx_slab_page_t *)0x0)) {
    lVar4 = lVar4 + pnVar3->slab;
    page->slab = pages + pnVar3->slab;
    *(ngx_slab_page_t **)(uVar1 + 8) = pnVar2;
    pnVar3->next->prev = uVar1;
    pnVar3->slab = 0;
    pnVar3->next = (ngx_slab_page_t *)0x0;
    pnVar3->prev = 0;
  }
  if ((pool->pages < page) && (((ulong)page[-1].prev & 3) == 0)) {
    pnVar3 = page + -1;
    if (page[-1].slab == 0) {
      pnVar3 = (ngx_slab_page_t *)page[-1].prev;
    }
    if (pnVar3->next != (ngx_slab_page_t *)0x0) {
      lVar4 = lVar4 + pnVar3->slab;
      uVar1 = pnVar3->prev;
      pnVar3->slab = pnVar3->slab + page->slab;
      *(ngx_slab_page_t **)((uVar1 & 0xfffffffffffffffc) + 8) = pnVar3->next;
      pnVar3->next->prev = uVar1;
      page->slab = 0;
      page->next = (ngx_slab_page_t *)0x0;
      page->prev = 0;
      page = pnVar3;
    }
  }
  if (lVar4 != 0) {
    page[lVar4].prev = (uintptr_t)page;
  }
  page->prev = (uintptr_t)&pool->free;
  pnVar3 = (pool->free).next;
  page->next = pnVar3;
  pnVar3->prev = (uintptr_t)page;
  (pool->free).next = page;
  return;
}

Assistant:

static void
ngx_slab_free_pages(ngx_slab_pool_t *pool, ngx_slab_page_t *page,
    ngx_uint_t pages)
{
    ngx_slab_page_t  *prev, *join;

    pool->pfree += pages;

    page->slab = pages--;

    if (pages) {
        ngx_memzero(&page[1], pages * sizeof(ngx_slab_page_t));
    }

    if (page->next) {
        prev = ngx_slab_page_prev(page);
        prev->next = page->next;
        page->next->prev = page->prev;
    }

    join = page + page->slab;

    if (join < pool->last) {

        if (ngx_slab_page_type(join) == NGX_SLAB_PAGE) {

            if (join->next != NULL) {
                pages += join->slab;
                page->slab += join->slab;

                prev = ngx_slab_page_prev(join);
                prev->next = join->next;
                join->next->prev = join->prev;

                join->slab = NGX_SLAB_PAGE_FREE;
                join->next = NULL;
                join->prev = NGX_SLAB_PAGE;
            }
        }
    }

    if (page > pool->pages) {
        join = page - 1;

        if (ngx_slab_page_type(join) == NGX_SLAB_PAGE) {

            if (join->slab == NGX_SLAB_PAGE_FREE) {
                join = ngx_slab_page_prev(join);
            }

            if (join->next != NULL) {
                pages += join->slab;
                join->slab += page->slab;

                prev = ngx_slab_page_prev(join);
                prev->next = join->next;
                join->next->prev = join->prev;

                page->slab = NGX_SLAB_PAGE_FREE;
                page->next = NULL;
                page->prev = NGX_SLAB_PAGE;

                page = join;
            }
        }
    }

    if (pages) {
        page[pages].prev = (uintptr_t) page;
    }

    page->prev = (uintptr_t) &pool->free;
    page->next = pool->free.next;

    page->next->prev = (uintptr_t) page;

    pool->free.next = page;
}